

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

bool __thiscall olc::ResourcePack::SavePack(ResourcePack *this,string *sFile,string *sKey)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  size_type sVar4;
  long lVar5;
  streamoff sVar6;
  uchar *puVar7;
  reference ppVar8;
  size_type sVar9;
  char *pcVar10;
  undefined1 auVar11 [16];
  undefined4 local_524;
  undefined1 local_520 [4];
  uint32_t nIndexStringLen;
  vector<char,_std::allocator<char>_> sIndexString;
  size_t nPathSize_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
  *e_2;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
  *__range1_2;
  anon_class_8_1_6bf940be write;
  vector<char,_std::allocator<char>_> stream;
  ifstream i;
  allocator<unsigned_char> local_2b1;
  undefined1 local_2b0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vBuffer;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
  *e_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
  *__range1_1;
  streampos offset;
  size_t nPathSize;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
  *e;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
  *__range1;
  uint32_t nMapSize;
  uint32_t nIndexSize;
  char local_228 [8];
  ofstream ofs;
  string *sKey_local;
  string *sFile_local;
  ResourcePack *this_local;
  
  std::ofstream::ofstream(local_228,(string *)sFile,_S_bin);
  bVar2 = std::ofstream::is_open();
  if ((bVar2 & 1) == 0) {
    this_local._7_1_ = false;
    nMapSize = 1;
  }
  else {
    __range1._4_4_ = 0;
    std::ostream::write(local_228,(long)&__range1 + 4);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
            ::size(&this->mapFiles);
    __range1._0_4_ = (undefined4)sVar4;
    std::ostream::write(local_228,(long)&__range1);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::begin(&this->mapFiles);
    e = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
           ::end(&this->mapFiles);
    while( true ) {
      bVar3 = std::operator!=(&__end1,(_Self *)&e);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
               ::operator*(&__end1);
      offset._M_state = (__mbstate_t)std::__cxx11::string::size();
      std::ostream::write(local_228,(long)&offset._M_state);
      lVar5 = std::__cxx11::string::c_str();
      std::ostream::write(local_228,lVar5);
      std::ostream::write(local_228,(long)&ppVar8->second);
      std::ostream::write(local_228,(long)&(ppVar8->second).nOffset);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
      ::operator++(&__end1);
    }
    auVar11 = std::ostream::tellp();
    offset._M_off = auVar11._8_8_;
    __range1_1 = auVar11._0_8_;
    sVar6 = std::fpos::operator_cast_to_long((fpos *)&__range1_1);
    __range1._4_4_ = (undefined4)sVar6;
    __end1_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
               ::begin(&this->mapFiles);
    e_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::end(&this->mapFiles);
    while( true ) {
      bVar3 = std::operator!=(&__end1_1,(_Self *)&e_1);
      if (!bVar3) break;
      vBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
                    ::operator*(&__end1_1);
      sVar6 = std::fpos::operator_cast_to_long((fpos *)&__range1_1);
      *(int *)(vBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x24) = (int)sVar6;
      uVar1 = *(uint *)(vBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x20);
      std::allocator<unsigned_char>::allocator(&local_2b1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0,(ulong)uVar1,
                 &local_2b1);
      std::allocator<unsigned_char>::~allocator(&local_2b1);
      std::ifstream::ifstream
                (&stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 (string *)
                 vBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,_S_bin);
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
      std::istream::read(&stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                         (long)puVar7);
      std::ifstream::close();
      puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
      std::ostream::write(local_228,(long)puVar7);
      std::fpos<__mbstate_t>::operator+=
                ((fpos<__mbstate_t> *)&__range1_1,
                 (ulong)*(uint *)(vBuffer.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x20));
      std::ifstream::~ifstream
                (&stream.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
      ::operator++(&__end1_1);
    }
    std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&write);
    __range1_2 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
                  *)&write;
    SavePack::anon_class_8_1_6bf940be::operator()
              ((anon_class_8_1_6bf940be *)&__range1_2,(char *)&__range1,4);
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
               ::begin(&this->mapFiles);
    e_2 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>
           *)std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::end(&this->mapFiles);
    while( true ) {
      bVar3 = std::operator!=(&__end1_2,(_Self *)&e_2);
      if (!bVar3) break;
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
               ::operator*(&__end1_2);
      sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
           std::__cxx11::string::size();
      SavePack::anon_class_8_1_6bf940be::operator()
                ((anon_class_8_1_6bf940be *)&__range1_2,
                 &sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,4)
      ;
      pcVar10 = (char *)std::__cxx11::string::c_str();
      SavePack::anon_class_8_1_6bf940be::operator()
                ((anon_class_8_1_6bf940be *)&__range1_2,pcVar10,
                 sIndexString.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_);
      SavePack::anon_class_8_1_6bf940be::operator()
                ((anon_class_8_1_6bf940be *)&__range1_2,(char *)&ppVar8->second,4);
      SavePack::anon_class_8_1_6bf940be::operator()
                ((anon_class_8_1_6bf940be *)&__range1_2,(char *)&(ppVar8->second).nOffset,4);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>
      ::operator++(&__end1_2);
    }
    scramble((vector<char,_std::allocator<char>_> *)local_520,this,
             (vector<char,_std::allocator<char>_> *)&write,sKey);
    sVar9 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_520);
    local_524 = (undefined4)sVar9;
    std::ostream::seekp((long)local_228,_S_beg);
    std::ostream::write(local_228,(long)&local_524);
    pcVar10 = std::vector<char,_std::allocator<char>_>::data
                        ((vector<char,_std::allocator<char>_> *)local_520);
    std::ostream::write(local_228,(long)pcVar10);
    std::ofstream::close();
    this_local._7_1_ = true;
    nMapSize = 1;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_520);
    std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&write)
    ;
  }
  std::ofstream::~ofstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool ResourcePack::SavePack(const std::string& sFile, const std::string& sKey)
	{
		// Create/Overwrite the resource file
		std::ofstream ofs(sFile, std::ofstream::binary);
		if (!ofs.is_open()) return false;

		// Iterate through map
		uint32_t nIndexSize = 0; // Unknown for now
		ofs.write((char*)&nIndexSize, sizeof(uint32_t));
		uint32_t nMapSize = uint32_t(mapFiles.size());
		ofs.write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			ofs.write((char*)&nPathSize, sizeof(uint32_t));
			ofs.write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			ofs.write((char*)&e.second.nSize, sizeof(uint32_t));
			ofs.write((char*)&e.second.nOffset, sizeof(uint32_t));
		}

		// 2) Write the individual Data
		std::streampos offset = ofs.tellp();
		nIndexSize = (uint32_t)offset;
		for (auto& e : mapFiles)
		{
			// Store beginning of file offset within resource pack file
			e.second.nOffset = (uint32_t)offset;

			// Load the file to be added
			std::vector<uint8_t> vBuffer(e.second.nSize);
			std::ifstream i(e.first, std::ifstream::binary);
			i.read((char*)vBuffer.data(), e.second.nSize);
			i.close();

			// Write the loaded file into resource pack file
			ofs.write((char*)vBuffer.data(), e.second.nSize);
			offset += e.second.nSize;
		}

		// 3) Scramble Index
		std::vector<char> stream;
		auto write = [&stream](const char* data, size_t size) {
			size_t sizeNow = stream.size();
			stream.resize(sizeNow + size);
			memcpy(stream.data() + sizeNow, data, size);
		};

		// Iterate through map
		write((char*)&nMapSize, sizeof(uint32_t));
		for (auto& e : mapFiles)
		{
			// Write the path of the file
			size_t nPathSize = e.first.size();
			write((char*)&nPathSize, sizeof(uint32_t));
			write(e.first.c_str(), nPathSize);

			// Write the file entry properties
			write((char*)&e.second.nSize, sizeof(uint32_t));
			write((char*)&e.second.nOffset, sizeof(uint32_t));
		}
		std::vector<char> sIndexString = scramble(stream, sKey);
		uint32_t nIndexStringLen = uint32_t(sIndexString.size());
		// 4) Rewrite Map (it has been updated with offsets now)
		// at start of file
		ofs.seekp(0, std::ios::beg);
		ofs.write((char*)&nIndexStringLen, sizeof(uint32_t));
		ofs.write(sIndexString.data(), nIndexStringLen);
		ofs.close();
		return true;
	}